

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O1

bool __thiscall
kj::anon_unknown_8::DiskHandle::tryCommitReplacement
          (DiskHandle *this,StringPtr toPath,int fromDirFd,StringPtr fromPath,WriteMode mode,
          int *errorReason)

{
  StringPtr path;
  StringPtr toPath_00;
  StringPtr fromPath_00;
  PathPtr finalName;
  bool bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Iface *pIVar4;
  String *pSVar5;
  size_t sVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  char *pcVar11;
  char *__old;
  byte unaff_R14B;
  ulong unaff_R15;
  ulong uVar12;
  StringPtr path_00;
  StringPtr path_01;
  StringPtr toPath_local;
  StringPtr fromPath_local;
  String away;
  NullableValue<kj::String> awayPath;
  Function<int_(kj::StringPtr)> local_108;
  Path toPathParsed;
  Fault f_4;
  anon_union_24_1_a8c68091_for_NullableValue<kj::String>_2 local_d8;
  Fault f;
  uint local_a8;
  
  fromPath_local.content.size_ = fromPath.content.size_;
  fromPath_local.content.ptr = fromPath.content.ptr;
  toPath_local.content.size_ = toPath.content.size_;
  toPath_local.content.ptr = toPath.content.ptr;
  if ((~mode & 3) == 0) {
    do {
      iVar7 = renameat(fromDirFd,fromPath_local.content.ptr,(this->fd).fd,toPath_local.content.ptr);
      if (-1 < iVar7) {
        unaff_R15 = 0;
        goto LAB_004c3e12;
      }
      uVar8 = kj::_::Debug::getOsErrorNumber(false);
    } while (uVar8 == 0xffffffff);
    unaff_R15 = (ulong)uVar8;
LAB_004c3e12:
    uVar8 = (uint)unaff_R15;
    unaff_R14B = uVar8 == 0;
    if ((bool)unaff_R14B) goto LAB_004c4680;
    if ((0x27 < uVar8) || ((0x8000320000U >> (unaff_R15 & 0x3f) & 1) == 0)) {
      if (errorReason == (int *)0x0) {
        kj::_::Debug::Fault::Fault<int,kj::StringPtr&,kj::StringPtr&>
                  (&f,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x42e,uVar8,"rename(fromPath, toPath)","fromPath, toPath",&fromPath_local,
                   &toPath_local);
        kj::_::Debug::Fault::~Fault(&f);
      }
      else {
        *errorReason = uVar8;
      }
      goto LAB_004c4680;
    }
  }
  if ((mode & MODIFY) == 0) {
    if ((mode & CREATE) != 0) {
      do {
        lVar9 = syscall(0x13c,(ulong)(uint)fromDirFd,fromPath_local.content.ptr,
                        (ulong)(uint)(this->fd).fd,toPath_local.content.ptr,1);
        if (-1 < lVar9) {
          unaff_R15 = 0;
          goto LAB_004c3f46;
        }
        uVar8 = kj::_::Debug::getOsErrorNumber(false);
      } while (uVar8 == 0xffffffff);
      unaff_R15 = (ulong)uVar8;
LAB_004c3f46:
      iVar7 = (int)unaff_R15;
      if (iVar7 == 0) {
        unaff_R14B = 1;
        bVar1 = false;
      }
      else if (iVar7 == 0x26) {
        bVar1 = true;
      }
      else {
        if (iVar7 != 0x11) {
          if (errorReason == (int *)0x0) {
            kj::_::Debug::Fault::Fault<int,kj::StringPtr&,kj::StringPtr&>
                      (&f,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                       ,0x467,iVar7,"renameat2(fromPath, toPath, NOREPLACE)","fromPath, toPath",
                       &fromPath_local,&toPath_local);
            kj::_::Debug::Fault::~Fault(&f);
          }
          else {
            *errorReason = iVar7;
          }
        }
        bVar1 = false;
        unaff_R14B = 0;
      }
      if (!bVar1) goto LAB_004c4680;
    }
  }
  else {
    do {
      uVar10 = (ulong)(uint)(this->fd).fd;
      lVar9 = syscall(0x13c,(ulong)(uint)fromDirFd,fromPath_local.content.ptr,uVar10,
                      toPath_local.content.ptr,2);
      if (-1 < lVar9) {
        uVar12 = 0;
        goto LAB_004c3ec6;
      }
      uVar8 = kj::_::Debug::getOsErrorNumber(false);
    } while (uVar8 == 0xffffffff);
    uVar12 = (ulong)uVar8;
LAB_004c3ec6:
    iVar7 = (int)uVar12;
    if (iVar7 == 0) {
      path_00.content.size_ = uVar10;
      path_00.content.ptr = (char *)fromPath_local.content.size_;
      rmrf((anon_unknown_8 *)(ulong)(uint)fromDirFd,(int)fromPath_local.content.ptr,path_00);
      unaff_R14B = 1;
      unaff_R15 = 0;
    }
    else if (iVar7 == 0x26) {
      unaff_R15 = CONCAT71((int7)(uVar12 >> 8),1);
    }
    else {
      if (iVar7 == 2) {
        if ((mode & CREATE) != 0) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,char_const(&)[120],kj::StringPtr&,kj::StringPtr&>
                    (&f,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                     ,1099,FAILED,(char *)0x0,
                     "\"rename(tmp, path) claimed path exists but \" \"renameat2(fromPath, toPath, EXCAHNGE) said it doest; concurrent modification?\", fromPath, toPath"
                     ,(char (*) [120])
                      "rename(tmp, path) claimed path exists but renameat2(fromPath, toPath, EXCAHNGE) said it doest; concurrent modification?"
                     ,&fromPath_local,&toPath_local);
          kj::_::Debug::Fault::~Fault(&f);
        }
      }
      else if (errorReason == (int *)0x0) {
        kj::_::Debug::Fault::Fault<int,kj::StringPtr&,kj::StringPtr&>
                  (&f,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x452,iVar7,"renameat2(fromPath, toPath, EXCHANGE)","fromPath, toPath",
                   &fromPath_local,&toPath_local);
        kj::_::Debug::Fault::~Fault(&f);
      }
      else {
        *errorReason = iVar7;
      }
      unaff_R15 = 0;
      unaff_R14B = 0;
    }
    if ((char)unaff_R15 == '\0') goto LAB_004c4680;
  }
  if ((~mode & 3) == 0) {
    do {
      iVar7 = fstatat((this->fd).fd,toPath_local.content.ptr,(stat *)&f,0x100);
      if (-1 < iVar7) {
        iVar7 = 0;
        break;
      }
      iVar7 = kj::_::Debug::getOsErrorNumber(false);
    } while (iVar7 == -1);
    if (iVar7 == 0) {
      path.content.size_ = (size_t)toPath_local.content.ptr;
      path.content.ptr = (char *)0x4c418f;
      Path::parse(path);
      away.content.ptr = (char *)0x0;
      away.content.size_ = 0;
      away.content.disposer = (ArrayDisposer *)0x0;
      finalName.parts.size_ = toPathParsed.parts.size_;
      finalName.parts.ptr = toPathParsed.parts.ptr;
      local_108.impl.ptr = (Iface *)operator_new(0x18);
      (local_108.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___00653870;
      local_108.impl.ptr[1]._vptr_Iface = (_func_int **)&f;
      local_108.impl.ptr[2]._vptr_Iface = (_func_int **)this;
      local_108.impl.disposer =
           (Disposer *)
           &kj::_::
            HeapDisposer<kj::Function<int(kj::StringPtr)>::Impl<kj::(anonymous_namespace)::DiskHandle::tryCommitReplacement(kj::StringPtr,int,kj::StringPtr,kj::WriteMode,int*)const::{lambda(kj::StringPtr)#1}>>
            ::instance;
      createNamedTemporary((Maybe<kj::String> *)&f_4,this,finalName,CREATE,&local_108);
      pIVar4 = local_108.impl.ptr;
      awayPath.isSet = f_4.exception._0_1_;
      if (f_4.exception._0_1_ == true) {
        awayPath.field_1.value.content.ptr = local_d8.value.content.ptr;
        awayPath.field_1.value.content.size_ = local_d8.value.content.size_;
        awayPath.field_1.value.content.disposer = local_d8.value.content.disposer;
      }
      if (local_108.impl.ptr != (Iface *)0x0) {
        local_108.impl.ptr = (Iface *)0x0;
        (**(local_108.impl.disposer)->_vptr_Disposer)
                  (local_108.impl.disposer,pIVar4->_vptr_Iface[-2] + (long)&pIVar4->_vptr_Iface);
      }
      uVar2 = awayPath.field_1.value.content.size_;
      uVar3 = awayPath.field_1.value.content.ptr;
      if (awayPath.isSet == true) {
        awayPath.field_1.value.content.ptr = (char *)0x0;
        awayPath.field_1.value.content.size_ = 0;
        away.content.disposer = awayPath.field_1.value.content.disposer;
      }
      else {
        unaff_R14B = 0;
        uVar2 = away.content.size_;
        uVar3 = away.content.ptr;
      }
      if (awayPath.isSet != false) {
        do {
          pcVar11 = "";
          if (uVar2 != 0) {
            pcVar11 = (char *)uVar3;
          }
          iVar7 = (this->fd).fd;
          iVar7 = renameat(iVar7,toPath_local.content.ptr,iVar7,pcVar11);
          if (-1 < iVar7) {
            iVar7 = 0;
            break;
          }
          iVar7 = kj::_::Debug::getOsErrorNumber(false);
        } while (iVar7 == -1);
        if (iVar7 != 0) {
          f_4.exception = (Exception *)0x0;
          awayPath.isSet = false;
          awayPath._1_7_ = 0;
          awayPath.field_1.value.content.ptr = (char *)0x0;
          kj::_::Debug::Fault::init
                    (&f_4,(EVP_PKEY_CTX *)
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                    );
          pcVar11 = "";
          if (uVar2 != 0) {
            pcVar11 = (char *)uVar3;
          }
          unlinkat((this->fd).fd,pcVar11,(uint)((local_a8 & 0xf000) == 0x4000) << 9);
          kj::_::Debug::Fault::~Fault(&f_4);
          unaff_R14B = 0;
        }
        if (iVar7 == 0) {
          do {
            pcVar11 = toPath_local.content.ptr;
            iVar7 = renameat(fromDirFd,fromPath_local.content.ptr,(this->fd).fd,
                             toPath_local.content.ptr);
            if (-1 < iVar7) {
              uVar8 = 0;
              break;
            }
            uVar8 = kj::_::Debug::getOsErrorNumber(false);
          } while (uVar8 == 0xffffffff);
          if (uVar8 != 0) {
            do {
              __old = "";
              if (uVar2 != 0) {
                __old = (char *)uVar3;
              }
              iVar7 = (this->fd).fd;
              pcVar11 = toPath_local.content.ptr;
              iVar7 = renameat(iVar7,__old,iVar7,toPath_local.content.ptr);
            } while ((iVar7 < 0) && (iVar7 = kj::_::Debug::getOsErrorNumber(false), iVar7 == -1));
            if (errorReason == (int *)0x0) {
              pcVar11 = (char *)(ulong)uVar8;
              kj::_::Debug::Fault::Fault<int,kj::StringPtr&,kj::StringPtr&>
                        ((Fault *)&awayPath,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                         ,0x4aa,uVar8,"rename(fromPath, toPath)","fromPath, toPath",&fromPath_local,
                         &toPath_local);
              kj::_::Debug::Fault::~Fault((Fault *)&awayPath);
            }
            else {
              *errorReason = uVar8;
            }
            unaff_R14B = 0;
          }
          if (uVar8 == 0) {
            if (uVar2 == 0) {
              iVar7 = 0x515344;
            }
            else {
              iVar7 = (int)uVar3;
            }
            path_01.content.ptr = (char *)(uVar2 + (ulong)(uVar2 == 0));
            unaff_R14B = 1;
            path_01.content.size_ = (size_t)pcVar11;
            rmrf((anon_unknown_8 *)(ulong)(uint)(this->fd).fd,iVar7,path_01);
          }
        }
      }
      if ((char *)uVar3 != (char *)0x0) {
        (**(away.content.disposer)->_vptr_ArrayDisposer)
                  (away.content.disposer,uVar3,1,uVar2,uVar2,0);
      }
      sVar6 = toPathParsed.parts.size_;
      pSVar5 = toPathParsed.parts.ptr;
      if (toPathParsed.parts.ptr != (String *)0x0) {
        toPathParsed.parts.ptr = (String *)0x0;
        toPathParsed.parts.size_ = 0;
        (**(toPathParsed.parts.disposer)->_vptr_ArrayDisposer)
                  (toPathParsed.parts.disposer,pSVar5,0x18,sVar6,sVar6,
                   ArrayDisposer::Dispose_<kj::String,_false>::destruct);
      }
    }
    else {
      f_4.exception = (Exception *)0x0;
      awayPath.isSet = false;
      awayPath._1_7_ = 0;
      awayPath.field_1.value.content.ptr = (char *)0x0;
      kj::_::Debug::Fault::init
                (&f_4,(EVP_PKEY_CTX *)
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                );
      kj::_::Debug::Fault::~Fault(&f_4);
      unaff_R14B = 0;
    }
    goto LAB_004c4680;
  }
  if ((mode & CREATE) == 0) {
    if ((mode & MODIFY) == 0) {
      unaff_R14B = 0;
      goto LAB_004c4680;
    }
    do {
      iVar7 = fstatat((this->fd).fd,toPath_local.content.ptr,(stat *)&f,0x100);
      if (-1 < iVar7) {
        iVar7 = 0;
        break;
      }
      uVar8 = kj::_::Debug::getOsErrorNumber(false);
      unaff_R15 = unaff_R15 & 0xffffffff;
      if (uVar8 != 0xffffffff) {
        unaff_R15 = (ulong)uVar8;
      }
      iVar7 = (int)unaff_R15;
    } while (uVar8 == 0xffffffff);
    if (((iVar7 != 0) && (unaff_R14B = 0, iVar7 != 2)) && (iVar7 != 0x14)) {
      kj::_::Debug::Fault::Fault<int,kj::StringPtr&>
                ((Fault *)&awayPath,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x4cb,iVar7,"fstatat(fd, toPath)","toPath",&toPath_local);
      kj::_::Debug::Fault::~Fault((Fault *)&awayPath);
      unaff_R14B = 0;
    }
    if (iVar7 != 0) goto LAB_004c4680;
  }
  else {
    do {
      iVar7 = fstatat((this->fd).fd,toPath_local.content.ptr,(stat *)&f,0x100);
      if (-1 < iVar7) {
        iVar7 = 0;
        break;
      }
      uVar8 = kj::_::Debug::getOsErrorNumber(false);
      unaff_R15 = unaff_R15 & 0xffffffff;
      if (uVar8 != 0xffffffff) {
        unaff_R15 = (ulong)uVar8;
      }
      iVar7 = (int)unaff_R15;
    } while (uVar8 == 0xffffffff);
    if (iVar7 == 0) {
LAB_004c4333:
      bVar1 = false;
      unaff_R14B = 0;
    }
    else {
      bVar1 = true;
      if ((iVar7 != 2) && (iVar7 != 0x14)) {
        kj::_::Debug::Fault::Fault<int,kj::StringPtr&>
                  ((Fault *)&awayPath,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x4c0,iVar7,"fstatat(fd, toPath)","toPath",&toPath_local);
        kj::_::Debug::Fault::~Fault((Fault *)&awayPath);
        goto LAB_004c4333;
      }
    }
    if (!bVar1) goto LAB_004c4680;
  }
  toPath_00.content.size_ = toPath_local.content.size_;
  toPath_00.content.ptr = toPath_local.content.ptr;
  fromPath_00.content.size_ = fromPath_local.content.size_;
  fromPath_00.content.ptr = fromPath_local.content.ptr;
  unaff_R14B = tryCommitReplacement(this,toPath_00,fromDirFd,fromPath_00,MODIFY|CREATE,errorReason);
LAB_004c4680:
  return (bool)(unaff_R14B & 1);
}

Assistant:

bool tryCommitReplacement(StringPtr toPath, int fromDirFd, StringPtr fromPath, WriteMode mode,
                            int* errorReason = nullptr) const {
    if (has(mode, WriteMode::CREATE) && has(mode, WriteMode::MODIFY)) {
      // Always clobber. Try it.
      KJ_SYSCALL_HANDLE_ERRORS(renameat(fromDirFd, fromPath.cStr(), fd.get(), toPath.cStr())) {
        case EISDIR:
        case ENOTDIR:
        case ENOTEMPTY:
        case EEXIST:
          // Failed because target exists and due to the various weird quirks of rename(), it
          // can't remove it for us. On Linux we can try an exchange instead. On others we have
          // to move the target out of the way.
          break;
        default:
          if (errorReason == nullptr) {
            KJ_FAIL_SYSCALL("rename(fromPath, toPath)", error, fromPath, toPath) { return false; }
          } else {
            *errorReason = error;
            return false;
          }
      } else {
        return true;
      }
    }

#if __linux__ && defined(RENAME_EXCHANGE)
    // Try to use Linux's renameat2() to atomically check preconditions and apply.

    if (has(mode, WriteMode::MODIFY)) {
      // Use an exchange to implement modification.
      //
      // We reach this branch when performing a MODIFY-only, or when performing a CREATE | MODIFY
      // in which we determined above that there's a node of a different type blocking the
      // exchange.

      KJ_SYSCALL_HANDLE_ERRORS(syscall(SYS_renameat2,
          fromDirFd, fromPath.cStr(), fd.get(), toPath.cStr(), RENAME_EXCHANGE)) {
        case ENOSYS:
          break;  // fall back to traditional means
        case ENOENT:
          // Presumably because the target path doesn't exist.
          if (has(mode, WriteMode::CREATE)) {
            KJ_FAIL_ASSERT("rename(tmp, path) claimed path exists but "
                "renameat2(fromPath, toPath, EXCAHNGE) said it doest; concurrent modification?",
                fromPath, toPath) { return false; }
          } else {
            // Assume target doesn't exist.
            return false;
          }
        default:
          if (errorReason == nullptr) {
            KJ_FAIL_SYSCALL("renameat2(fromPath, toPath, EXCHANGE)", error, fromPath, toPath) {
              return false;
            }
          } else {
            *errorReason = error;
            return false;
          }
      } else {
        // Successful swap! Delete swapped-out content.
        rmrf(fromDirFd, fromPath);
        return true;
      }
    } else if (has(mode, WriteMode::CREATE)) {
      KJ_SYSCALL_HANDLE_ERRORS(syscall(SYS_renameat2,
          fromDirFd, fromPath.cStr(), fd.get(), toPath.cStr(), RENAME_NOREPLACE)) {
        case ENOSYS:
          break;  // fall back to traditional means
        case EEXIST:
          return false;
        default:
          if (errorReason == nullptr) {
            KJ_FAIL_SYSCALL("renameat2(fromPath, toPath, NOREPLACE)", error, fromPath, toPath) {
              return false;
            }
          } else {
            *errorReason = error;
            return false;
          }
      } else {
        return true;
      }
    }
#endif

    // We're unable to do what we wanted atomically. :(

    if (has(mode, WriteMode::CREATE) && has(mode, WriteMode::MODIFY)) {
      // We failed to atomically delete the target previously. So now we need to do two calls in
      // rapid succession to move the old file away then move the new one into place.

      // Find out what kind of file exists at the target path.
      struct stat stats;
      KJ_SYSCALL(fstatat(fd, toPath.cStr(), &stats, AT_SYMLINK_NOFOLLOW)) { return false; }

      // Create a temporary location to move the existing object to. Note that rename() allows a
      // non-directory to replace a non-directory, and allows a directory to replace an empty
      // directory. So we have to create the right type.
      Path toPathParsed = Path::parse(toPath);
      String away;
      KJ_IF_MAYBE(awayPath, createNamedTemporary(toPathParsed, WriteMode::CREATE,
          [&](StringPtr candidatePath) {
        if (S_ISDIR(stats.st_mode)) {
          return mkdirat(fd, candidatePath.cStr(), 0700);
        } else {
#if __APPLE__
          // No mknodat() on OSX, gotta open() a file, ugh.
          int newFd = openat(fd, candidatePath.cStr(),
                             O_RDWR | O_CREAT | O_EXCL | MAYBE_O_CLOEXEC, 0700);
          if (newFd >= 0) close(newFd);
          return newFd;
#else
          return mknodat(fd, candidatePath.cStr(), S_IFREG | 0600, dev_t());
#endif
        }
      })) {
        away = kj::mv(*awayPath);
      } else {
        // Already threw.
        return false;
      }

      // OK, now move the target object to replace the thing we just created.
      KJ_SYSCALL(renameat(fd, toPath.cStr(), fd, away.cStr())) {
        // Something went wrong. Remove the thing we just created.
        unlinkat(fd, away.cStr(), S_ISDIR(stats.st_mode) ? AT_REMOVEDIR : 0);
        return false;
      }

      // Now move the source object to the target location.
      KJ_SYSCALL_HANDLE_ERRORS(renameat(fromDirFd, fromPath.cStr(), fd, toPath.cStr())) {
        default:
          // Try to put things back where they were. If this fails, though, then we have little
          // choice but to leave things broken.
          KJ_SYSCALL_HANDLE_ERRORS(renameat(fd, away.cStr(), fd, toPath.cStr())) {
            default: break;
          }

          if (errorReason == nullptr) {
            KJ_FAIL_SYSCALL("rename(fromPath, toPath)", error, fromPath, toPath) {
              return false;
            }
          } else {
            *errorReason = error;
            return false;
          }
      }

      // OK, success. Delete the old content.
      rmrf(fd, away);
      return true;
    } else {
      // Only one of CREATE or MODIFY is specified, so we need to verify non-atomically that the
      // corresponding precondition (must-not-exist or must-exist, respectively) is held.
      if (has(mode, WriteMode::CREATE)) {
        struct stat stats;
        KJ_SYSCALL_HANDLE_ERRORS(fstatat(fd.get(), toPath.cStr(), &stats, AT_SYMLINK_NOFOLLOW)) {
          case ENOENT:
          case ENOTDIR:
            break;  // doesn't exist; continue
          default:
            KJ_FAIL_SYSCALL("fstatat(fd, toPath)", error, toPath) { return false; }
        } else {
          return false;  // already exists; fail
        }
      } else if (has(mode, WriteMode::MODIFY)) {
        struct stat stats;
        KJ_SYSCALL_HANDLE_ERRORS(fstatat(fd.get(), toPath.cStr(), &stats, AT_SYMLINK_NOFOLLOW)) {
          case ENOENT:
          case ENOTDIR:
            return false;  // doesn't exist; fail
          default:
            KJ_FAIL_SYSCALL("fstatat(fd, toPath)", error, toPath) { return false; }
        } else {
          // already exists; continue
        }
      } else {
        // Neither CREATE nor MODIFY.
        return false;
      }

      // Start over in create-and-modify mode.
      return tryCommitReplacement(toPath, fromDirFd, fromPath,
                                  WriteMode::CREATE | WriteMode::MODIFY,
                                  errorReason);
    }
  }